

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

string * helics::checkFedQuery_abi_cxx11_(BasicFedInfo *fed,string_view query)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  char *in_RCX;
  size_t in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *response;
  char *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  ConnectionState in_stack_ffffffffffffff6f;
  
  this = in_RDI;
  std::__cxx11::string::string(in_RDI);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)in_RDI);
  __x._M_str = in_stack_ffffffffffffff60;
  __x._M_len = in_stack_ffffffffffffff58;
  bVar1 = std::operator==(__x,in_stack_ffffffffffffff48);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)in_RDI);
    __x_00._M_str = in_stack_ffffffffffffff60;
    __x_00._M_len = in_stack_ffffffffffffff58;
    bVar1 = std::operator==(__x_00,in_stack_ffffffffffffff48);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(*(byte *)(in_RSI + 0x2c) < 3,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff28);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)in_RDI);
      __x_01._M_str = in_stack_ffffffffffffff60;
      __x_01._M_len = in_stack_ffffffffffffff58;
      bVar1 = std::operator==(__x_01,in_stack_ffffffffffffff48);
      if (bVar1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(this,(char)((ulong)in_RDI >> 0x38));
        stateString_abi_cxx11_(in_stack_ffffffffffffff6f);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this,in_RDI);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(this,(char)((ulong)in_RDI >> 0x38));
      }
      else {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)this,(char *)in_RDI);
        __x_02._M_str = in_RCX;
        __x_02._M_len = in_RDX;
        bVar1 = std::operator==(__x_02,in_stack_ffffffffffffff48);
        if ((bVar1) && (1 < *(byte *)(in_RSI + 0x2c))) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
        }
      }
    }
  }
  return this;
}

Assistant:

static std::string checkFedQuery(const BasicFedInfo& fed, std::string_view query)
{
    std::string response;
    if (query == "exists") {
        response = "true";
    } else if (query == "isconnected") {
        response =
            (fed.state >= ConnectionState::CONNECTED && fed.state <= ConnectionState::OPERATING) ?
            "true" :
            "false";
    } else if (query == "state") {
        response.push_back('"');
        response.append(stateString(fed.state));
        response.push_back('"');
    } else if (query == "isinit") {
        if (fed.state >= ConnectionState::OPERATING) {
            response = "true";
            // if it is false we need to actually go check the federate directly
        }
    }
    return response;
}